

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O2

int __thiscall
ABlasterFX1::DoSpecialDamage(ABlasterFX1 *this,AActor *target,int damage,FName damagetype)

{
  bool bVar1;
  uint uVar2;
  PClass *base;
  
  base = PClass::FindClass("Ironlich");
  bVar1 = DObject::IsKindOf((DObject *)target,base);
  if (bVar1) {
    uVar2 = FRandom::operator()(&pr_bfx1);
    damage = -(uint)((uVar2 & 1) == 0) | 1;
  }
  return damage;
}

Assistant:

int ABlasterFX1::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	if (target->IsKindOf (PClass::FindClass ("Ironlich")))
	{ // Less damage to Ironlich bosses
		damage = pr_bfx1() & 1;
		if (!damage)
		{
			return -1;
		}
	}
	return damage;
}